

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *
despot::logging::InitializeLogStreams(void)

{
  reference pplVar1;
  log_ostream *plVar2;
  vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *in_RDI;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  undefined1 local_99;
  string local_98;
  undefined1 local_71;
  string local_70;
  undefined1 local_49;
  string local_48;
  allocator<despot::log_ostream_*> local_12;
  undefined1 local_11;
  vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *streams;
  
  local_11 = 0;
  std::allocator<despot::log_ostream_*>::allocator(&local_12);
  std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::vector
            (in_RDI,6,&local_12);
  std::allocator<despot::log_ostream_*>::~allocator(&local_12);
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,0);
  *pplVar1 = (value_type)0x0;
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_49 = 1;
  std::__cxx11::string::string((string *)&local_48,(string *)(markers__abi_cxx11_ + 0x20));
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_48);
  local_49 = 0;
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,1);
  *pplVar1 = plVar2;
  std::__cxx11::string::~string((string *)&local_48);
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_71 = 1;
  std::__cxx11::string::string((string *)&local_70,(string *)(markers__abi_cxx11_ + 0x40));
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_70);
  local_71 = 0;
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,2);
  *pplVar1 = plVar2;
  std::__cxx11::string::~string((string *)&local_70);
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_99 = 1;
  std::__cxx11::string::string((string *)&local_98,(string *)(markers__abi_cxx11_ + 0x60));
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_98);
  local_99 = 0;
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,3);
  *pplVar1 = plVar2;
  std::__cxx11::string::~string((string *)&local_98);
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_c1 = 1;
  std::__cxx11::string::string((string *)&local_c0,(string *)(markers__abi_cxx11_ + 0x80));
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_c0);
  local_c1 = 0;
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,4);
  *pplVar1 = plVar2;
  std::__cxx11::string::~string((string *)&local_c0);
  plVar2 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_e8,(string *)(markers__abi_cxx11_ + 0xa0));
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_e8);
  pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                      (in_RDI,5);
  *pplVar1 = plVar2;
  std::__cxx11::string::~string((string *)&local_e8);
  return in_RDI;
}

Assistant:

vector<log_ostream*> logging::InitializeLogStreams() {
	vector<log_ostream*> streams(6);

	streams[NONE] = NULL;
	streams[ERROR] = new log_ostream(cerr, markers_[ERROR]);
	streams[WARN] = new log_ostream(cerr, markers_[WARN]);
	streams[INFO] = new log_ostream(cerr, markers_[INFO]);
	streams[DEBUG] = new log_ostream(cerr, markers_[DEBUG]);
	streams[VERBOSE] = new log_ostream(cerr, markers_[VERBOSE]);

	return streams;
}